

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O1

void __thiscall
HighsSearch::setRINSNeighbourhood
          (HighsSearch *this,vector<double,_std::allocator<double>_> *basesol,
          vector<double,_std::allocator<double>_> *relaxsol)

{
  HighsLp *pHVar1;
  HighsMipSolver *pHVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  HighsDomainChange boundchg;
  HighsDomainChange boundchg_00;
  
  pHVar2 = this->mipsolver;
  pHVar1 = pHVar2->model_;
  if (pHVar1->num_col_ != 0) {
    uVar3 = 0;
    do {
      if ((pHVar1->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar3] == kInteger) {
        dVar6 = (this->localdom).col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar3];
        dVar5 = (this->localdom).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar3];
        if ((dVar6 != dVar5) || (NAN(dVar6) || NAN(dVar5))) {
          dVar4 = floor((basesol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar3] + 0.5);
          if (ABS((relaxsol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar3] - dVar4) <
              ((pHVar2->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol) {
            if (dVar6 < dVar4) {
              if (dVar4 <= dVar5) {
                dVar5 = dVar4;
              }
              boundchg.column = (int)uVar3;
              boundchg.boundtype = (int)(uVar3 >> 0x20);
              boundchg.boundval = dVar5;
              HighsDomain::changeBound(&this->localdom,boundchg,(Reason)0xfffffffe);
            }
            if (dVar4 < (this->localdom).col_upper_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar3]) {
              dVar6 = (this->localdom).col_lower_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar3];
              if (dVar6 <= dVar4) {
                dVar6 = dVar4;
              }
              boundchg_00._8_8_ = uVar3 + 0x100000000;
              boundchg_00.boundval = dVar6;
              HighsDomain::changeBound(&this->localdom,boundchg_00,(Reason)0xfffffffe);
            }
          }
        }
      }
      uVar3 = uVar3 + 1;
      pHVar2 = this->mipsolver;
      pHVar1 = pHVar2->model_;
    } while (uVar3 != (uint)pHVar1->num_col_);
  }
  return;
}

Assistant:

void HighsSearch::setRINSNeighbourhood(const std::vector<double>& basesol,
                                       const std::vector<double>& relaxsol) {
  for (HighsInt i = 0; i != mipsolver.numCol(); ++i) {
    if (mipsolver.variableType(i) != HighsVarType::kInteger) continue;
    if (localdom.col_lower_[i] == localdom.col_upper_[i]) continue;

    double intval = std::floor(basesol[i] + 0.5);
    if (std::abs(relaxsol[i] - intval) < mipsolver.mipdata_->feastol) {
      if (localdom.col_lower_[i] < intval)
        localdom.changeBound(HighsBoundType::kLower, i,
                             std::min(intval, localdom.col_upper_[i]),
                             HighsDomain::Reason::unspecified());
      if (localdom.col_upper_[i] > intval)
        localdom.changeBound(HighsBoundType::kUpper, i,
                             std::max(intval, localdom.col_lower_[i]),
                             HighsDomain::Reason::unspecified());
    }
  }
}